

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O1

int buminiz::mz_inflateInit2(mz_streamp pStream,int window_bits)

{
  int iVar1;
  mz_internal_state *pmVar2;
  
  if (pStream != (mz_streamp)0x0) {
    if ((window_bits == 0xf) || (iVar1 = -10000, window_bits == -0xf)) {
      pStream->data_type = 0;
      pStream->total_in = 0;
      pStream->total_out = 0;
      pStream->msg = (char *)0x0;
      pStream->adler = 0;
      pStream->reserved = 0;
      if (pStream->zalloc == (mz_alloc_func)0x0) {
        pStream->zalloc = def_alloc_func;
      }
      if (pStream->zfree == (mz_free_func)0x0) {
        pStream->zfree = def_free_func;
      }
      pmVar2 = (mz_internal_state *)(*pStream->zalloc)(pStream->opaque,1,0xab10);
      if (pmVar2 == (mz_internal_state *)0x0) {
        iVar1 = -4;
      }
      else {
        pStream->state = pmVar2;
        *(undefined4 *)pmVar2 = 0;
        *(undefined4 *)(pmVar2 + 0xab0c) = 1;
        *(undefined8 *)(pmVar2 + 11000) = 0;
        *(undefined8 *)(pmVar2 + 0x2b00) = 1;
        *(int *)(pmVar2 + 0x2b08) = window_bits;
        iVar1 = 0;
      }
    }
    return iVar1;
  }
  return -2;
}

Assistant:

int mz_inflateInit2(mz_streamp pStream, int window_bits)
{
  inflate_state *pDecomp;
  if (!pStream) return MZ_STREAM_ERROR;
  if ((window_bits != MZ_DEFAULT_WINDOW_BITS) && (-window_bits != MZ_DEFAULT_WINDOW_BITS)) return MZ_PARAM_ERROR;

  pStream->data_type = 0;
  pStream->adler = 0;
  pStream->msg = NULL;
  pStream->total_in = 0;
  pStream->total_out = 0;
  pStream->reserved = 0;
  if (!pStream->zalloc) pStream->zalloc = def_alloc_func;
  if (!pStream->zfree) pStream->zfree = def_free_func;

  pDecomp = (inflate_state*)pStream->zalloc(pStream->opaque, 1, sizeof(inflate_state));
  if (!pDecomp) return MZ_MEM_ERROR;

  pStream->state = (struct mz_internal_state *)pDecomp;

  tinfl_init(&pDecomp->m_decomp);
  pDecomp->m_dict_ofs = 0;
  pDecomp->m_dict_avail = 0;
  pDecomp->m_last_status = TINFL_STATUS_NEEDS_MORE_INPUT;
  pDecomp->m_first_call = 1;
  pDecomp->m_has_flushed = 0;
  pDecomp->m_window_bits = window_bits;

  return MZ_OK;
}